

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_init_mt_sync(AV1_COMP *cpi,int is_first_pass)

{
  AV1_COMMON *cm;
  AV1LfSync *lf_sync;
  AV1LrSync *lr_sync;
  int iVar1;
  aom_internal_error_info *src;
  AV1_PRIMARY *pAVar2;
  int iVar3;
  pthread_mutex_t *ppVar4;
  pthread_cond_t *__cond;
  PrimaryMultiThreadInfo *pPVar5;
  
  iVar3 = _setjmp((__jmp_buf_tag *)((cpi->common).error)->jmp);
  if (iVar3 != 0) {
    src = (cpi->common).error;
    src->setjmp = 0;
    aom_internal_error_copy(&cpi->ppi->error,src);
  }
  ((cpi->common).error)->setjmp = 1;
  if ((is_first_pass != 0) || ((cpi->oxcf).row_mt == true)) {
    if ((cpi->mt_info).enc_row_mt.mutex_ == (pthread_mutex_t *)0x0) {
      ppVar4 = (pthread_mutex_t *)aom_malloc(0x28);
      (cpi->mt_info).enc_row_mt.mutex_ = ppVar4;
      if (ppVar4 == (pthread_mutex_t *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate enc_row_mt->mutex_");
        ppVar4 = (cpi->mt_info).enc_row_mt.mutex_;
        if (ppVar4 == (pthread_mutex_t *)0x0) goto LAB_001ad094;
      }
      pthread_mutex_init((pthread_mutex_t *)ppVar4,(pthread_mutexattr_t *)0x0);
    }
LAB_001ad094:
    if ((cpi->mt_info).enc_row_mt.cond_ == (pthread_cond_t *)0x0) {
      __cond = (pthread_cond_t *)aom_malloc(0x30);
      (cpi->mt_info).enc_row_mt.cond_ = (pthread_cond_t *)__cond;
      if (__cond == (pthread_cond_t *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate enc_row_mt->cond_");
        __cond = (pthread_cond_t *)(cpi->mt_info).enc_row_mt.cond_;
        if (__cond == (pthread_cond_t *)0x0) goto LAB_001ad0e5;
      }
      pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
    }
LAB_001ad0e5:
    if (is_first_pass != 0) goto LAB_001ad37e;
  }
  if ((cpi->mt_info).gm_sync.mutex_ == (pthread_mutex_t *)0x0) {
    ppVar4 = (pthread_mutex_t *)aom_malloc(0x28);
    (cpi->mt_info).gm_sync.mutex_ = ppVar4;
    if (ppVar4 == (pthread_mutex_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate gm_sync->mutex_");
      ppVar4 = (cpi->mt_info).gm_sync.mutex_;
      if (ppVar4 == (pthread_mutex_t *)0x0) goto LAB_001ad13e;
    }
    pthread_mutex_init((pthread_mutex_t *)ppVar4,(pthread_mutexattr_t *)0x0);
  }
LAB_001ad13e:
  if ((cpi->mt_info).tf_sync.mutex_ == (pthread_mutex_t *)0x0) {
    ppVar4 = (pthread_mutex_t *)aom_malloc(0x28);
    (cpi->mt_info).tf_sync.mutex_ = ppVar4;
    if (ppVar4 == (pthread_mutex_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tf_sync->mutex_");
      ppVar4 = (cpi->mt_info).tf_sync.mutex_;
      if (ppVar4 == (pthread_mutex_t *)0x0) goto LAB_001ad18f;
    }
    pthread_mutex_init((pthread_mutex_t *)ppVar4,(pthread_mutexattr_t *)0x0);
  }
LAB_001ad18f:
  if ((cpi->mt_info).cdef_sync.mutex_ == (pthread_mutex_t *)0x0) {
    ppVar4 = (pthread_mutex_t *)aom_malloc(0x28);
    (cpi->mt_info).cdef_sync.mutex_ = ppVar4;
    if (ppVar4 == (pthread_mutex_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cdef_sync->mutex_");
      ppVar4 = (cpi->mt_info).cdef_sync.mutex_;
      if (ppVar4 == (pthread_mutex_t *)0x0) goto LAB_001ad1e0;
    }
    pthread_mutex_init((pthread_mutex_t *)ppVar4,(pthread_mutexattr_t *)0x0);
  }
LAB_001ad1e0:
  iVar3 = ((cpi->common).height >> 2) + 0x1f >> 5;
  pAVar2 = cpi->ppi;
  pPVar5 = (PrimaryMultiThreadInfo *)((pAVar2->p_mt_info).num_mod_workers + 5);
  if (1 < (pAVar2->p_mt_info).num_mod_workers[10]) {
    pPVar5 = &pAVar2->p_mt_info;
  }
  cm = &cpi->common;
  iVar1 = pPVar5->num_workers;
  if ((((cpi->mt_info).lf_row_sync.sync_range == 0) || (iVar3 != (cpi->mt_info).lf_row_sync.rows))
     || ((cpi->mt_info).lf_row_sync.num_workers < iVar1)) {
    lf_sync = &(cpi->mt_info).lf_row_sync;
    av1_loop_filter_dealloc(lf_sync);
    av1_loop_filter_alloc(lf_sync,cm,iVar3,(cpi->common).width,iVar1);
  }
  if ((cpi->mt_info).tpl_row_mt.mutex_ == (pthread_mutex_t *)0x0) {
    ppVar4 = (pthread_mutex_t *)aom_malloc(0x28);
    (cpi->mt_info).tpl_row_mt.mutex_ = ppVar4;
    if (ppVar4 == (pthread_mutex_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tpl_row_mt->mutex_");
      ppVar4 = (cpi->mt_info).tpl_row_mt.mutex_;
      if (ppVar4 == (pthread_mutex_t *)0x0) goto LAB_001ad2aa;
    }
    pthread_mutex_init((pthread_mutex_t *)ppVar4,(pthread_mutexattr_t *)0x0);
  }
LAB_001ad2aa:
  iVar3 = is_restoration_used(cm);
  if (iVar3 != 0) {
    iVar3 = av1_lr_count_units((cpi->sf).lpf_sf.min_lr_unit_size,(cpi->common).height);
    pPVar5 = (PrimaryMultiThreadInfo *)((pAVar2->p_mt_info).num_mod_workers + 8);
    if (1 < (pAVar2->p_mt_info).num_mod_workers[10]) {
      pPVar5 = &pAVar2->p_mt_info;
    }
    iVar1 = pPVar5->num_workers;
    if ((((cpi->mt_info).lr_row_sync.sync_range == 0) || ((cpi->mt_info).lr_row_sync.rows < iVar3))
       || (((cpi->mt_info).lr_row_sync.num_workers < iVar1 ||
           ((cpi->mt_info).lr_row_sync.num_planes < 3)))) {
      lr_sync = &(cpi->mt_info).lr_row_sync;
      av1_loop_restoration_dealloc(lr_sync);
      av1_loop_restoration_alloc(lr_sync,cm,iVar1,iVar3,3,(cpi->common).width);
    }
  }
  if ((cpi->mt_info).pack_bs_sync.mutex_ == (pthread_mutex_t *)0x0) {
    ppVar4 = (pthread_mutex_t *)aom_malloc(0x28);
    (cpi->mt_info).pack_bs_sync.mutex_ = ppVar4;
    if (ppVar4 == (pthread_mutex_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate pack_bs_sync->mutex_");
      ppVar4 = (cpi->mt_info).pack_bs_sync.mutex_;
      if (ppVar4 == (pthread_mutex_t *)0x0) goto LAB_001ad37e;
    }
    pthread_mutex_init((pthread_mutex_t *)ppVar4,(pthread_mutexattr_t *)0x0);
  }
LAB_001ad37e:
  ((cpi->common).error)->setjmp = 0;
  return;
}

Assistant:

void av1_init_mt_sync(AV1_COMP *cpi, int is_first_pass) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;

  if (setjmp(cm->error->jmp)) {
    cm->error->setjmp = 0;
    aom_internal_error_copy(&cpi->ppi->error, cm->error);
  }
  cm->error->setjmp = 1;
  // Initialize enc row MT object.
  if (is_first_pass || cpi->oxcf.row_mt == 1) {
    AV1EncRowMultiThreadInfo *enc_row_mt = &mt_info->enc_row_mt;
    if (enc_row_mt->mutex_ == NULL) {
      CHECK_MEM_ERROR(cm, enc_row_mt->mutex_,
                      aom_malloc(sizeof(*(enc_row_mt->mutex_))));
      if (enc_row_mt->mutex_) pthread_mutex_init(enc_row_mt->mutex_, NULL);
    }
    if (enc_row_mt->cond_ == NULL) {
      CHECK_MEM_ERROR(cm, enc_row_mt->cond_,
                      aom_malloc(sizeof(*(enc_row_mt->cond_))));
      if (enc_row_mt->cond_) pthread_cond_init(enc_row_mt->cond_, NULL);
    }
  }

  if (!is_first_pass) {
    // Initialize global motion MT object.
    AV1GlobalMotionSync *gm_sync = &mt_info->gm_sync;
    if (gm_sync->mutex_ == NULL) {
      CHECK_MEM_ERROR(cm, gm_sync->mutex_,
                      aom_malloc(sizeof(*(gm_sync->mutex_))));
      if (gm_sync->mutex_) pthread_mutex_init(gm_sync->mutex_, NULL);
    }
#if !CONFIG_REALTIME_ONLY
    // Initialize temporal filtering MT object.
    AV1TemporalFilterSync *tf_sync = &mt_info->tf_sync;
    if (tf_sync->mutex_ == NULL) {
      CHECK_MEM_ERROR(cm, tf_sync->mutex_,
                      aom_malloc(sizeof(*tf_sync->mutex_)));
      if (tf_sync->mutex_) pthread_mutex_init(tf_sync->mutex_, NULL);
    }
#endif  // !CONFIG_REALTIME_ONLY
        // Initialize CDEF MT object.
    AV1CdefSync *cdef_sync = &mt_info->cdef_sync;
    if (cdef_sync->mutex_ == NULL) {
      CHECK_MEM_ERROR(cm, cdef_sync->mutex_,
                      aom_malloc(sizeof(*(cdef_sync->mutex_))));
      if (cdef_sync->mutex_) pthread_mutex_init(cdef_sync->mutex_, NULL);
    }

    // Initialize loop filter MT object.
    AV1LfSync *lf_sync = &mt_info->lf_row_sync;
    // Number of superblock rows
    const int sb_rows =
        CEIL_POWER_OF_TWO(cm->height >> MI_SIZE_LOG2, MAX_MIB_SIZE_LOG2);
    PrimaryMultiThreadInfo *const p_mt_info = &cpi->ppi->p_mt_info;
    int num_lf_workers = av1_get_num_mod_workers_for_alloc(p_mt_info, MOD_LPF);

    if (!lf_sync->sync_range || sb_rows != lf_sync->rows ||
        num_lf_workers > lf_sync->num_workers) {
      av1_loop_filter_dealloc(lf_sync);
      av1_loop_filter_alloc(lf_sync, cm, sb_rows, cm->width, num_lf_workers);
    }

    // Initialize tpl MT object.
    AV1TplRowMultiThreadInfo *tpl_row_mt = &mt_info->tpl_row_mt;
    if (tpl_row_mt->mutex_ == NULL) {
      CHECK_MEM_ERROR(cm, tpl_row_mt->mutex_,
                      aom_malloc(sizeof(*(tpl_row_mt->mutex_))));
      if (tpl_row_mt->mutex_) pthread_mutex_init(tpl_row_mt->mutex_, NULL);
    }

#if !CONFIG_REALTIME_ONLY
    if (is_restoration_used(cm)) {
      // Initialize loop restoration MT object.
      AV1LrSync *lr_sync = &mt_info->lr_row_sync;
      int rst_unit_size = cpi->sf.lpf_sf.min_lr_unit_size;
      int num_rows_lr = av1_lr_count_units(rst_unit_size, cm->height);
      int num_lr_workers = av1_get_num_mod_workers_for_alloc(p_mt_info, MOD_LR);
      if (!lr_sync->sync_range || num_rows_lr > lr_sync->rows ||
          num_lr_workers > lr_sync->num_workers ||
          MAX_MB_PLANE > lr_sync->num_planes) {
        av1_loop_restoration_dealloc(lr_sync);
        av1_loop_restoration_alloc(lr_sync, cm, num_lr_workers, num_rows_lr,
                                   MAX_MB_PLANE, cm->width);
      }
    }
#endif

    // Initialization of pack bitstream MT object.
    AV1EncPackBSSync *pack_bs_sync = &mt_info->pack_bs_sync;
    if (pack_bs_sync->mutex_ == NULL) {
      CHECK_MEM_ERROR(cm, pack_bs_sync->mutex_,
                      aom_malloc(sizeof(*pack_bs_sync->mutex_)));
      if (pack_bs_sync->mutex_) pthread_mutex_init(pack_bs_sync->mutex_, NULL);
    }
  }
  cm->error->setjmp = 0;
}